

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2b.c
# Opt level: O1

int blake2b_compress(hash_state *md,uchar *buf)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [16];
  undefined1 auVar37 [32];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [32];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  
  lVar1 = *(long *)buf;
  lVar2 = *(long *)(buf + 8);
  lVar3 = *(long *)(buf + 0x10);
  lVar4 = *(long *)(buf + 0x18);
  lVar5 = *(long *)(buf + 0x20);
  lVar6 = *(long *)(buf + 0x28);
  lVar7 = *(long *)(buf + 0x30);
  lVar8 = *(long *)(buf + 0x38);
  lVar9 = *(long *)(buf + 0x40);
  lVar10 = *(long *)(buf + 0x48);
  lVar11 = *(long *)(buf + 0x50);
  lVar12 = *(long *)(buf + 0x58);
  lVar13 = *(long *)(buf + 0x60);
  lVar14 = *(long *)(buf + 0x68);
  lVar15 = *(long *)(buf + 0x70);
  lVar16 = *(long *)(buf + 0x78);
  auVar37 = *(undefined1 (*) [32])(md->dummy + 0x40) ^ _DAT_001a84a0;
  uVar18 = (long)md->data + lVar1 + (md->whirlpool).state[3];
  uVar24 = auVar37._0_8_ ^ uVar18;
  uVar25 = uVar24 >> 0x20 | uVar24 << 0x20;
  uVar20 = uVar25 + 0x6a09e667f3bcc908;
  uVar24 = (md->whirlpool).state[3] ^ uVar20;
  uVar24 = uVar24 >> 0x18 | uVar24 << 0x28;
  uVar19 = uVar18 + lVar2 + uVar24;
  uVar25 = uVar25 ^ uVar19;
  uVar26 = uVar25 >> 0x10 | uVar25 << 0x30;
  uVar20 = uVar20 + uVar26;
  uVar24 = uVar24 ^ uVar20;
  uVar24 = uVar24 >> 0x3f | uVar24 << 1;
  uVar18 = vpextrq_avx(auVar37._0_16_,1);
  uVar22 = (md->whirlpool).state[0] + (md->whirlpool).state[4] + lVar3;
  uVar18 = uVar18 ^ uVar22;
  uVar18 = uVar18 >> 0x20 | uVar18 << 0x20;
  uVar17 = uVar18 + 0xbb67ae8584caa73b;
  uVar25 = (md->whirlpool).state[4] ^ uVar17;
  uVar25 = uVar25 >> 0x18 | uVar25 << 0x28;
  uVar23 = uVar22 + lVar4 + uVar25;
  uVar18 = uVar18 ^ uVar23;
  uVar22 = uVar18 >> 0x10 | uVar18 << 0x30;
  uVar17 = uVar17 + uVar22;
  uVar25 = uVar25 ^ uVar17;
  uVar21 = uVar25 >> 0x3f | uVar25 << 1;
  uVar25 = (md->whirlpool).state[1] + (md->whirlpool).state[5] + lVar5;
  uVar18 = auVar37._16_8_ ^ uVar25;
  uVar29 = uVar18 >> 0x20 | uVar18 << 0x20;
  uVar18 = uVar29 + 0x3c6ef372fe94f82b;
  uVar31 = (md->whirlpool).state[5] ^ uVar18;
  uVar31 = uVar31 >> 0x18 | uVar31 << 0x28;
  uVar27 = uVar25 + lVar6 + uVar31;
  uVar29 = uVar29 ^ uVar27;
  uVar30 = uVar29 >> 0x10 | uVar29 << 0x30;
  uVar18 = uVar18 + uVar30;
  uVar31 = uVar31 ^ uVar18;
  uVar32 = uVar31 >> 0x3f | uVar31 << 1;
  uVar29 = (md->whirlpool).state[2] + (md->whirlpool).state[6] + lVar7;
  uVar25 = vpextrq_avx(auVar37._16_16_,1);
  uVar25 = uVar25 ^ uVar29;
  uVar31 = uVar25 >> 0x20 | uVar25 << 0x20;
  uVar25 = uVar31 + 0xa54ff53a5f1d36f1;
  uVar28 = (md->whirlpool).state[6] ^ uVar25;
  uVar28 = uVar28 >> 0x18 | uVar28 << 0x28;
  uVar29 = uVar29 + lVar8 + uVar28;
  uVar31 = uVar31 ^ uVar29;
  uVar31 = uVar31 >> 0x10 | uVar31 << 0x30;
  uVar25 = uVar25 + uVar31;
  uVar28 = uVar28 ^ uVar25;
  uVar28 = uVar28 >> 0x3f | uVar28 << 1;
  uVar19 = uVar19 + lVar9 + uVar21;
  uVar31 = uVar31 ^ uVar19;
  uVar31 = uVar31 >> 0x20 | uVar31 << 0x20;
  uVar18 = uVar18 + uVar31;
  uVar21 = uVar21 ^ uVar18;
  uVar21 = uVar21 >> 0x18 | uVar21 << 0x28;
  uVar19 = uVar19 + lVar10 + uVar21;
  uVar31 = uVar31 ^ uVar19;
  uVar31 = uVar31 >> 0x10 | uVar31 << 0x30;
  uVar18 = uVar18 + uVar31;
  uVar21 = uVar21 ^ uVar18;
  uVar21 = uVar21 >> 0x3f | uVar21 << 1;
  uVar23 = uVar23 + lVar11 + uVar32;
  uVar26 = uVar26 ^ uVar23;
  uVar26 = uVar26 >> 0x20 | uVar26 << 0x20;
  uVar25 = uVar25 + uVar26;
  uVar32 = uVar32 ^ uVar25;
  uVar32 = uVar32 >> 0x18 | uVar32 << 0x28;
  uVar23 = uVar23 + lVar12 + uVar32;
  uVar26 = uVar26 ^ uVar23;
  uVar26 = uVar26 >> 0x10 | uVar26 << 0x30;
  uVar25 = uVar25 + uVar26;
  uVar32 = uVar32 ^ uVar25;
  uVar32 = uVar32 >> 0x3f | uVar32 << 1;
  uVar27 = uVar27 + lVar13 + uVar28;
  uVar22 = uVar22 ^ uVar27;
  uVar22 = uVar22 >> 0x20 | uVar22 << 0x20;
  uVar20 = uVar20 + uVar22;
  uVar28 = uVar28 ^ uVar20;
  uVar28 = uVar28 >> 0x18 | uVar28 << 0x28;
  uVar27 = uVar27 + lVar14 + uVar28;
  uVar22 = uVar22 ^ uVar27;
  uVar22 = uVar22 >> 0x10 | uVar22 << 0x30;
  uVar20 = uVar20 + uVar22;
  uVar28 = uVar28 ^ uVar20;
  uVar28 = uVar28 >> 0x3f | uVar28 << 1;
  uVar29 = uVar29 + lVar15 + uVar24;
  uVar30 = uVar30 ^ uVar29;
  uVar30 = uVar30 >> 0x20 | uVar30 << 0x20;
  uVar17 = uVar17 + uVar30;
  uVar24 = uVar24 ^ uVar17;
  uVar24 = uVar24 >> 0x18 | uVar24 << 0x28;
  uVar29 = uVar29 + lVar16 + uVar24;
  uVar30 = uVar30 ^ uVar29;
  uVar30 = uVar30 >> 0x10 | uVar30 << 0x30;
  uVar17 = uVar17 + uVar30;
  uVar24 = uVar24 ^ uVar17;
  uVar24 = uVar24 >> 0x3f | uVar24 << 1;
  uVar19 = uVar19 + lVar15 + uVar24;
  uVar26 = uVar26 ^ uVar19;
  uVar26 = uVar26 >> 0x20 | uVar26 << 0x20;
  uVar20 = uVar20 + uVar26;
  uVar24 = uVar24 ^ uVar20;
  uVar24 = uVar24 >> 0x18 | uVar24 << 0x28;
  uVar19 = uVar19 + lVar11 + uVar24;
  uVar26 = uVar26 ^ uVar19;
  uVar26 = uVar26 >> 0x10 | uVar26 << 0x30;
  uVar20 = uVar20 + uVar26;
  uVar24 = uVar24 ^ uVar20;
  uVar24 = uVar24 >> 0x3f | uVar24 << 1;
  uVar23 = uVar23 + lVar5 + uVar21;
  uVar22 = uVar22 ^ uVar23;
  uVar22 = uVar22 >> 0x20 | uVar22 << 0x20;
  uVar17 = uVar17 + uVar22;
  uVar21 = uVar21 ^ uVar17;
  uVar21 = uVar21 >> 0x18 | uVar21 << 0x28;
  uVar23 = uVar23 + lVar9 + uVar21;
  uVar22 = uVar22 ^ uVar23;
  uVar22 = uVar22 >> 0x10 | uVar22 << 0x30;
  uVar17 = uVar17 + uVar22;
  uVar21 = uVar21 ^ uVar17;
  uVar21 = uVar21 >> 0x3f | uVar21 << 1;
  uVar27 = uVar27 + lVar10 + uVar32;
  uVar30 = uVar30 ^ uVar27;
  uVar30 = uVar30 >> 0x20 | uVar30 << 0x20;
  uVar18 = uVar18 + uVar30;
  uVar32 = uVar32 ^ uVar18;
  uVar32 = uVar32 >> 0x18 | uVar32 << 0x28;
  uVar27 = uVar27 + lVar16 + uVar32;
  uVar30 = uVar30 ^ uVar27;
  uVar30 = uVar30 >> 0x10 | uVar30 << 0x30;
  uVar18 = uVar18 + uVar30;
  uVar32 = uVar32 ^ uVar18;
  uVar32 = uVar32 >> 0x3f | uVar32 << 1;
  uVar29 = uVar29 + lVar14 + uVar28;
  uVar31 = uVar31 ^ uVar29;
  uVar31 = uVar31 >> 0x20 | uVar31 << 0x20;
  uVar25 = uVar25 + uVar31;
  uVar28 = uVar28 ^ uVar25;
  uVar28 = uVar28 >> 0x18 | uVar28 << 0x28;
  uVar29 = uVar29 + lVar7 + uVar28;
  uVar31 = uVar31 ^ uVar29;
  uVar31 = uVar31 >> 0x10 | uVar31 << 0x30;
  uVar25 = uVar25 + uVar31;
  uVar28 = uVar28 ^ uVar25;
  uVar28 = uVar28 >> 0x3f | uVar28 << 1;
  uVar19 = uVar19 + lVar2 + uVar21;
  uVar31 = uVar31 ^ uVar19;
  uVar31 = uVar31 >> 0x20 | uVar31 << 0x20;
  uVar18 = uVar18 + uVar31;
  uVar21 = uVar21 ^ uVar18;
  uVar21 = uVar21 >> 0x18 | uVar21 << 0x28;
  uVar19 = uVar19 + lVar13 + uVar21;
  uVar31 = uVar31 ^ uVar19;
  uVar31 = uVar31 >> 0x10 | uVar31 << 0x30;
  uVar18 = uVar18 + uVar31;
  uVar21 = uVar21 ^ uVar18;
  uVar21 = uVar21 >> 0x3f | uVar21 << 1;
  uVar23 = uVar23 + lVar1 + uVar32;
  uVar26 = uVar26 ^ uVar23;
  uVar26 = uVar26 >> 0x20 | uVar26 << 0x20;
  uVar25 = uVar25 + uVar26;
  uVar32 = uVar32 ^ uVar25;
  uVar32 = uVar32 >> 0x18 | uVar32 << 0x28;
  uVar23 = uVar23 + lVar3 + uVar32;
  uVar26 = uVar26 ^ uVar23;
  uVar26 = uVar26 >> 0x10 | uVar26 << 0x30;
  uVar25 = uVar25 + uVar26;
  uVar32 = uVar32 ^ uVar25;
  uVar32 = uVar32 >> 0x3f | uVar32 << 1;
  uVar27 = uVar27 + lVar12 + uVar28;
  uVar22 = uVar22 ^ uVar27;
  uVar22 = uVar22 >> 0x20 | uVar22 << 0x20;
  uVar20 = uVar20 + uVar22;
  uVar28 = uVar28 ^ uVar20;
  uVar28 = uVar28 >> 0x18 | uVar28 << 0x28;
  uVar27 = uVar27 + lVar8 + uVar28;
  uVar22 = uVar22 ^ uVar27;
  uVar22 = uVar22 >> 0x10 | uVar22 << 0x30;
  uVar20 = uVar20 + uVar22;
  uVar28 = uVar28 ^ uVar20;
  uVar28 = uVar28 >> 0x3f | uVar28 << 1;
  uVar29 = uVar29 + lVar6 + uVar24;
  uVar30 = uVar30 ^ uVar29;
  uVar30 = uVar30 >> 0x20 | uVar30 << 0x20;
  uVar17 = uVar17 + uVar30;
  uVar24 = uVar24 ^ uVar17;
  uVar24 = uVar24 >> 0x18 | uVar24 << 0x28;
  uVar29 = uVar29 + lVar4 + uVar24;
  uVar30 = uVar30 ^ uVar29;
  uVar30 = uVar30 >> 0x10 | uVar30 << 0x30;
  uVar17 = uVar17 + uVar30;
  uVar24 = uVar24 ^ uVar17;
  uVar24 = uVar24 >> 0x3f | uVar24 << 1;
  uVar19 = uVar19 + lVar12 + uVar24;
  uVar26 = uVar26 ^ uVar19;
  uVar26 = uVar26 >> 0x20 | uVar26 << 0x20;
  uVar20 = uVar20 + uVar26;
  uVar24 = uVar24 ^ uVar20;
  uVar24 = uVar24 >> 0x18 | uVar24 << 0x28;
  uVar19 = uVar19 + lVar9 + uVar24;
  uVar26 = uVar26 ^ uVar19;
  uVar26 = uVar26 >> 0x10 | uVar26 << 0x30;
  uVar20 = uVar20 + uVar26;
  uVar24 = uVar24 ^ uVar20;
  uVar24 = uVar24 >> 0x3f | uVar24 << 1;
  uVar23 = uVar23 + lVar13 + uVar21;
  uVar22 = uVar22 ^ uVar23;
  uVar22 = uVar22 >> 0x20 | uVar22 << 0x20;
  uVar17 = uVar17 + uVar22;
  uVar21 = uVar21 ^ uVar17;
  uVar21 = uVar21 >> 0x18 | uVar21 << 0x28;
  uVar23 = uVar23 + lVar1 + uVar21;
  uVar22 = uVar22 ^ uVar23;
  uVar22 = uVar22 >> 0x10 | uVar22 << 0x30;
  uVar17 = uVar17 + uVar22;
  uVar21 = uVar21 ^ uVar17;
  uVar21 = uVar21 >> 0x3f | uVar21 << 1;
  uVar27 = uVar27 + lVar6 + uVar32;
  uVar30 = uVar30 ^ uVar27;
  uVar30 = uVar30 >> 0x20 | uVar30 << 0x20;
  uVar18 = uVar18 + uVar30;
  uVar32 = uVar32 ^ uVar18;
  uVar32 = uVar32 >> 0x18 | uVar32 << 0x28;
  uVar27 = uVar27 + lVar3 + uVar32;
  uVar30 = uVar30 ^ uVar27;
  uVar30 = uVar30 >> 0x10 | uVar30 << 0x30;
  uVar18 = uVar18 + uVar30;
  uVar32 = uVar32 ^ uVar18;
  uVar32 = uVar32 >> 0x3f | uVar32 << 1;
  uVar29 = uVar29 + lVar16 + uVar28;
  uVar31 = uVar31 ^ uVar29;
  uVar31 = uVar31 >> 0x20 | uVar31 << 0x20;
  uVar25 = uVar25 + uVar31;
  uVar28 = uVar28 ^ uVar25;
  uVar28 = uVar28 >> 0x18 | uVar28 << 0x28;
  uVar29 = uVar29 + lVar14 + uVar28;
  uVar31 = uVar31 ^ uVar29;
  uVar31 = uVar31 >> 0x10 | uVar31 << 0x30;
  uVar25 = uVar25 + uVar31;
  uVar28 = uVar28 ^ uVar25;
  uVar28 = uVar28 >> 0x3f | uVar28 << 1;
  uVar19 = uVar19 + lVar11 + uVar21;
  uVar31 = uVar31 ^ uVar19;
  uVar31 = uVar31 >> 0x20 | uVar31 << 0x20;
  uVar18 = uVar18 + uVar31;
  uVar21 = uVar21 ^ uVar18;
  uVar21 = uVar21 >> 0x18 | uVar21 << 0x28;
  uVar19 = uVar19 + lVar15 + uVar21;
  uVar31 = uVar31 ^ uVar19;
  uVar31 = uVar31 >> 0x10 | uVar31 << 0x30;
  uVar18 = uVar18 + uVar31;
  uVar21 = uVar21 ^ uVar18;
  uVar21 = uVar21 >> 0x3f | uVar21 << 1;
  uVar23 = uVar23 + lVar4 + uVar32;
  uVar26 = uVar26 ^ uVar23;
  uVar26 = uVar26 >> 0x20 | uVar26 << 0x20;
  uVar25 = uVar25 + uVar26;
  uVar32 = uVar32 ^ uVar25;
  uVar32 = uVar32 >> 0x18 | uVar32 << 0x28;
  uVar23 = uVar23 + lVar7 + uVar32;
  uVar26 = uVar26 ^ uVar23;
  uVar26 = uVar26 >> 0x10 | uVar26 << 0x30;
  uVar25 = uVar25 + uVar26;
  uVar32 = uVar32 ^ uVar25;
  uVar32 = uVar32 >> 0x3f | uVar32 << 1;
  uVar27 = uVar27 + lVar8 + uVar28;
  uVar22 = uVar22 ^ uVar27;
  uVar22 = uVar22 >> 0x20 | uVar22 << 0x20;
  uVar20 = uVar20 + uVar22;
  uVar28 = uVar28 ^ uVar20;
  uVar28 = uVar28 >> 0x18 | uVar28 << 0x28;
  uVar27 = uVar27 + lVar2 + uVar28;
  uVar22 = uVar22 ^ uVar27;
  uVar22 = uVar22 >> 0x10 | uVar22 << 0x30;
  uVar20 = uVar20 + uVar22;
  uVar28 = uVar28 ^ uVar20;
  uVar28 = uVar28 >> 0x3f | uVar28 << 1;
  uVar29 = uVar29 + lVar10 + uVar24;
  uVar30 = uVar30 ^ uVar29;
  uVar30 = uVar30 >> 0x20 | uVar30 << 0x20;
  uVar17 = uVar17 + uVar30;
  uVar24 = uVar24 ^ uVar17;
  uVar24 = uVar24 >> 0x18 | uVar24 << 0x28;
  uVar29 = uVar29 + lVar5 + uVar24;
  uVar30 = uVar30 ^ uVar29;
  uVar30 = uVar30 >> 0x10 | uVar30 << 0x30;
  uVar17 = uVar17 + uVar30;
  uVar24 = uVar24 ^ uVar17;
  uVar24 = uVar24 >> 0x3f | uVar24 << 1;
  uVar19 = uVar19 + lVar8 + uVar24;
  uVar26 = uVar26 ^ uVar19;
  uVar26 = uVar26 >> 0x20 | uVar26 << 0x20;
  uVar20 = uVar20 + uVar26;
  uVar24 = uVar24 ^ uVar20;
  uVar24 = uVar24 >> 0x18 | uVar24 << 0x28;
  uVar19 = uVar19 + lVar10 + uVar24;
  uVar26 = uVar26 ^ uVar19;
  uVar26 = uVar26 >> 0x10 | uVar26 << 0x30;
  uVar20 = uVar20 + uVar26;
  uVar24 = uVar24 ^ uVar20;
  uVar24 = uVar24 >> 0x3f | uVar24 << 1;
  uVar23 = uVar23 + lVar4 + uVar21;
  uVar22 = uVar22 ^ uVar23;
  uVar22 = uVar22 >> 0x20 | uVar22 << 0x20;
  uVar17 = uVar17 + uVar22;
  uVar21 = uVar21 ^ uVar17;
  uVar21 = uVar21 >> 0x18 | uVar21 << 0x28;
  uVar23 = uVar23 + lVar2 + uVar21;
  uVar22 = uVar22 ^ uVar23;
  uVar22 = uVar22 >> 0x10 | uVar22 << 0x30;
  uVar17 = uVar17 + uVar22;
  uVar21 = uVar21 ^ uVar17;
  uVar21 = uVar21 >> 0x3f | uVar21 << 1;
  uVar27 = uVar27 + lVar14 + uVar32;
  uVar30 = uVar30 ^ uVar27;
  uVar30 = uVar30 >> 0x20 | uVar30 << 0x20;
  uVar18 = uVar18 + uVar30;
  uVar32 = uVar32 ^ uVar18;
  uVar32 = uVar32 >> 0x18 | uVar32 << 0x28;
  uVar27 = uVar27 + lVar13 + uVar32;
  uVar30 = uVar30 ^ uVar27;
  uVar30 = uVar30 >> 0x10 | uVar30 << 0x30;
  uVar18 = uVar18 + uVar30;
  uVar32 = uVar32 ^ uVar18;
  uVar32 = uVar32 >> 0x3f | uVar32 << 1;
  uVar29 = uVar29 + lVar12 + uVar28;
  uVar31 = uVar31 ^ uVar29;
  uVar31 = uVar31 >> 0x20 | uVar31 << 0x20;
  uVar25 = uVar25 + uVar31;
  uVar28 = uVar28 ^ uVar25;
  uVar28 = uVar28 >> 0x18 | uVar28 << 0x28;
  uVar29 = uVar29 + lVar15 + uVar28;
  uVar31 = uVar31 ^ uVar29;
  uVar31 = uVar31 >> 0x10 | uVar31 << 0x30;
  uVar25 = uVar25 + uVar31;
  uVar28 = uVar28 ^ uVar25;
  uVar28 = uVar28 >> 0x3f | uVar28 << 1;
  uVar19 = uVar19 + lVar3 + uVar21;
  uVar31 = uVar31 ^ uVar19;
  uVar31 = uVar31 >> 0x20 | uVar31 << 0x20;
  uVar18 = uVar18 + uVar31;
  uVar21 = uVar21 ^ uVar18;
  uVar21 = uVar21 >> 0x18 | uVar21 << 0x28;
  uVar19 = uVar19 + lVar7 + uVar21;
  uVar31 = uVar31 ^ uVar19;
  uVar31 = uVar31 >> 0x10 | uVar31 << 0x30;
  uVar18 = uVar18 + uVar31;
  uVar21 = uVar21 ^ uVar18;
  uVar21 = uVar21 >> 0x3f | uVar21 << 1;
  uVar23 = uVar23 + lVar6 + uVar32;
  uVar26 = uVar26 ^ uVar23;
  uVar26 = uVar26 >> 0x20 | uVar26 << 0x20;
  uVar25 = uVar25 + uVar26;
  uVar32 = uVar32 ^ uVar25;
  uVar32 = uVar32 >> 0x18 | uVar32 << 0x28;
  uVar23 = uVar23 + lVar11 + uVar32;
  uVar26 = uVar26 ^ uVar23;
  uVar26 = uVar26 >> 0x10 | uVar26 << 0x30;
  uVar25 = uVar25 + uVar26;
  uVar32 = uVar32 ^ uVar25;
  uVar32 = uVar32 >> 0x3f | uVar32 << 1;
  uVar27 = uVar27 + lVar5 + uVar28;
  uVar22 = uVar22 ^ uVar27;
  uVar22 = uVar22 >> 0x20 | uVar22 << 0x20;
  uVar20 = uVar20 + uVar22;
  uVar28 = uVar28 ^ uVar20;
  uVar28 = uVar28 >> 0x18 | uVar28 << 0x28;
  uVar27 = uVar27 + lVar1 + uVar28;
  uVar22 = uVar22 ^ uVar27;
  uVar22 = uVar22 >> 0x10 | uVar22 << 0x30;
  uVar20 = uVar20 + uVar22;
  uVar28 = uVar28 ^ uVar20;
  uVar28 = uVar28 >> 0x3f | uVar28 << 1;
  uVar29 = uVar29 + lVar16 + uVar24;
  uVar30 = uVar30 ^ uVar29;
  uVar30 = uVar30 >> 0x20 | uVar30 << 0x20;
  uVar17 = uVar17 + uVar30;
  uVar24 = uVar24 ^ uVar17;
  uVar24 = uVar24 >> 0x18 | uVar24 << 0x28;
  uVar29 = uVar29 + lVar9 + uVar24;
  uVar30 = uVar30 ^ uVar29;
  uVar30 = uVar30 >> 0x10 | uVar30 << 0x30;
  uVar17 = uVar17 + uVar30;
  uVar24 = uVar24 ^ uVar17;
  uVar24 = uVar24 >> 0x3f | uVar24 << 1;
  uVar19 = uVar19 + lVar10 + uVar24;
  uVar26 = uVar26 ^ uVar19;
  uVar26 = uVar26 >> 0x20 | uVar26 << 0x20;
  uVar20 = uVar20 + uVar26;
  uVar24 = uVar24 ^ uVar20;
  uVar24 = uVar24 >> 0x18 | uVar24 << 0x28;
  uVar19 = uVar19 + lVar1 + uVar24;
  uVar26 = uVar26 ^ uVar19;
  uVar26 = uVar26 >> 0x10 | uVar26 << 0x30;
  uVar20 = uVar20 + uVar26;
  uVar24 = uVar24 ^ uVar20;
  uVar24 = uVar24 >> 0x3f | uVar24 << 1;
  uVar23 = uVar23 + lVar6 + uVar21;
  uVar22 = uVar22 ^ uVar23;
  uVar22 = uVar22 >> 0x20 | uVar22 << 0x20;
  uVar17 = uVar17 + uVar22;
  uVar21 = uVar21 ^ uVar17;
  uVar21 = uVar21 >> 0x18 | uVar21 << 0x28;
  uVar23 = uVar23 + lVar8 + uVar21;
  uVar22 = uVar22 ^ uVar23;
  uVar22 = uVar22 >> 0x10 | uVar22 << 0x30;
  uVar17 = uVar17 + uVar22;
  uVar21 = uVar21 ^ uVar17;
  uVar21 = uVar21 >> 0x3f | uVar21 << 1;
  uVar27 = uVar27 + lVar3 + uVar32;
  uVar30 = uVar30 ^ uVar27;
  uVar30 = uVar30 >> 0x20 | uVar30 << 0x20;
  uVar18 = uVar18 + uVar30;
  uVar32 = uVar32 ^ uVar18;
  uVar32 = uVar32 >> 0x18 | uVar32 << 0x28;
  uVar27 = uVar27 + lVar5 + uVar32;
  uVar30 = uVar30 ^ uVar27;
  uVar30 = uVar30 >> 0x10 | uVar30 << 0x30;
  uVar18 = uVar18 + uVar30;
  uVar32 = uVar32 ^ uVar18;
  uVar32 = uVar32 >> 0x3f | uVar32 << 1;
  uVar29 = uVar29 + lVar11 + uVar28;
  uVar31 = uVar31 ^ uVar29;
  uVar31 = uVar31 >> 0x20 | uVar31 << 0x20;
  uVar25 = uVar25 + uVar31;
  uVar28 = uVar28 ^ uVar25;
  uVar28 = uVar28 >> 0x18 | uVar28 << 0x28;
  uVar29 = uVar29 + lVar16 + uVar28;
  uVar31 = uVar31 ^ uVar29;
  uVar31 = uVar31 >> 0x10 | uVar31 << 0x30;
  uVar25 = uVar25 + uVar31;
  uVar28 = uVar28 ^ uVar25;
  uVar28 = uVar28 >> 0x3f | uVar28 << 1;
  uVar19 = uVar19 + lVar15 + uVar21;
  uVar31 = uVar31 ^ uVar19;
  uVar31 = uVar31 >> 0x20 | uVar31 << 0x20;
  uVar18 = uVar18 + uVar31;
  uVar21 = uVar21 ^ uVar18;
  uVar21 = uVar21 >> 0x18 | uVar21 << 0x28;
  uVar19 = uVar19 + lVar2 + uVar21;
  uVar31 = uVar31 ^ uVar19;
  uVar31 = uVar31 >> 0x10 | uVar31 << 0x30;
  uVar18 = uVar18 + uVar31;
  uVar21 = uVar21 ^ uVar18;
  uVar21 = uVar21 >> 0x3f | uVar21 << 1;
  uVar23 = uVar23 + lVar12 + uVar32;
  uVar26 = uVar26 ^ uVar23;
  uVar26 = uVar26 >> 0x20 | uVar26 << 0x20;
  uVar25 = uVar25 + uVar26;
  uVar32 = uVar32 ^ uVar25;
  uVar32 = uVar32 >> 0x18 | uVar32 << 0x28;
  uVar23 = uVar23 + lVar13 + uVar32;
  uVar26 = uVar26 ^ uVar23;
  uVar26 = uVar26 >> 0x10 | uVar26 << 0x30;
  uVar25 = uVar25 + uVar26;
  uVar32 = uVar32 ^ uVar25;
  uVar32 = uVar32 >> 0x3f | uVar32 << 1;
  uVar27 = uVar27 + lVar7 + uVar28;
  uVar22 = uVar22 ^ uVar27;
  uVar22 = uVar22 >> 0x20 | uVar22 << 0x20;
  uVar20 = uVar20 + uVar22;
  uVar28 = uVar28 ^ uVar20;
  uVar28 = uVar28 >> 0x18 | uVar28 << 0x28;
  uVar27 = uVar27 + lVar9 + uVar28;
  uVar22 = uVar22 ^ uVar27;
  uVar22 = uVar22 >> 0x10 | uVar22 << 0x30;
  uVar20 = uVar20 + uVar22;
  uVar28 = uVar28 ^ uVar20;
  uVar28 = uVar28 >> 0x3f | uVar28 << 1;
  uVar29 = uVar29 + lVar4 + uVar24;
  uVar30 = uVar30 ^ uVar29;
  uVar30 = uVar30 >> 0x20 | uVar30 << 0x20;
  uVar17 = uVar17 + uVar30;
  uVar24 = uVar24 ^ uVar17;
  uVar24 = uVar24 >> 0x18 | uVar24 << 0x28;
  uVar29 = uVar29 + lVar14 + uVar24;
  uVar30 = uVar30 ^ uVar29;
  uVar30 = uVar30 >> 0x10 | uVar30 << 0x30;
  uVar17 = uVar17 + uVar30;
  uVar24 = uVar24 ^ uVar17;
  uVar24 = uVar24 >> 0x3f | uVar24 << 1;
  uVar19 = uVar19 + lVar3 + uVar24;
  uVar26 = uVar26 ^ uVar19;
  uVar26 = uVar26 >> 0x20 | uVar26 << 0x20;
  uVar20 = uVar20 + uVar26;
  uVar24 = uVar24 ^ uVar20;
  uVar24 = uVar24 >> 0x18 | uVar24 << 0x28;
  uVar19 = uVar19 + lVar13 + uVar24;
  uVar26 = uVar26 ^ uVar19;
  uVar26 = uVar26 >> 0x10 | uVar26 << 0x30;
  uVar20 = uVar20 + uVar26;
  uVar24 = uVar24 ^ uVar20;
  uVar24 = uVar24 >> 0x3f | uVar24 << 1;
  uVar23 = uVar23 + lVar7 + uVar21;
  uVar22 = uVar22 ^ uVar23;
  uVar22 = uVar22 >> 0x20 | uVar22 << 0x20;
  uVar17 = uVar17 + uVar22;
  uVar21 = uVar21 ^ uVar17;
  uVar21 = uVar21 >> 0x18 | uVar21 << 0x28;
  uVar23 = uVar23 + lVar11 + uVar21;
  uVar22 = uVar22 ^ uVar23;
  uVar22 = uVar22 >> 0x10 | uVar22 << 0x30;
  uVar17 = uVar17 + uVar22;
  uVar21 = uVar21 ^ uVar17;
  uVar21 = uVar21 >> 0x3f | uVar21 << 1;
  uVar27 = uVar27 + lVar1 + uVar32;
  uVar30 = uVar30 ^ uVar27;
  uVar30 = uVar30 >> 0x20 | uVar30 << 0x20;
  uVar18 = uVar18 + uVar30;
  uVar32 = uVar32 ^ uVar18;
  uVar32 = uVar32 >> 0x18 | uVar32 << 0x28;
  uVar27 = uVar27 + lVar12 + uVar32;
  uVar30 = uVar30 ^ uVar27;
  uVar30 = uVar30 >> 0x10 | uVar30 << 0x30;
  uVar18 = uVar18 + uVar30;
  uVar32 = uVar32 ^ uVar18;
  uVar32 = uVar32 >> 0x3f | uVar32 << 1;
  uVar29 = uVar29 + lVar9 + uVar28;
  uVar31 = uVar31 ^ uVar29;
  uVar31 = uVar31 >> 0x20 | uVar31 << 0x20;
  uVar25 = uVar25 + uVar31;
  uVar28 = uVar28 ^ uVar25;
  uVar28 = uVar28 >> 0x18 | uVar28 << 0x28;
  uVar29 = uVar29 + lVar4 + uVar28;
  uVar31 = uVar31 ^ uVar29;
  uVar31 = uVar31 >> 0x10 | uVar31 << 0x30;
  uVar25 = uVar25 + uVar31;
  uVar28 = uVar28 ^ uVar25;
  uVar28 = uVar28 >> 0x3f | uVar28 << 1;
  uVar19 = uVar19 + lVar5 + uVar21;
  uVar31 = uVar31 ^ uVar19;
  uVar31 = uVar31 >> 0x20 | uVar31 << 0x20;
  uVar18 = uVar18 + uVar31;
  uVar21 = uVar21 ^ uVar18;
  uVar21 = uVar21 >> 0x18 | uVar21 << 0x28;
  uVar19 = uVar19 + lVar14 + uVar21;
  uVar31 = uVar31 ^ uVar19;
  uVar31 = uVar31 >> 0x10 | uVar31 << 0x30;
  uVar18 = uVar18 + uVar31;
  uVar21 = uVar21 ^ uVar18;
  uVar21 = uVar21 >> 0x3f | uVar21 << 1;
  uVar23 = uVar23 + lVar8 + uVar32;
  uVar26 = uVar26 ^ uVar23;
  uVar26 = uVar26 >> 0x20 | uVar26 << 0x20;
  uVar25 = uVar25 + uVar26;
  uVar32 = uVar32 ^ uVar25;
  uVar32 = uVar32 >> 0x18 | uVar32 << 0x28;
  uVar23 = uVar23 + lVar6 + uVar32;
  uVar26 = uVar26 ^ uVar23;
  uVar26 = uVar26 >> 0x10 | uVar26 << 0x30;
  uVar25 = uVar25 + uVar26;
  uVar32 = uVar32 ^ uVar25;
  uVar32 = uVar32 >> 0x3f | uVar32 << 1;
  uVar27 = uVar27 + lVar16 + uVar28;
  uVar22 = uVar22 ^ uVar27;
  uVar22 = uVar22 >> 0x20 | uVar22 << 0x20;
  uVar20 = uVar20 + uVar22;
  uVar28 = uVar28 ^ uVar20;
  uVar28 = uVar28 >> 0x18 | uVar28 << 0x28;
  uVar27 = uVar27 + lVar15 + uVar28;
  uVar22 = uVar22 ^ uVar27;
  uVar22 = uVar22 >> 0x10 | uVar22 << 0x30;
  uVar20 = uVar20 + uVar22;
  uVar28 = uVar28 ^ uVar20;
  uVar28 = uVar28 >> 0x3f | uVar28 << 1;
  uVar29 = uVar29 + lVar2 + uVar24;
  uVar30 = uVar30 ^ uVar29;
  uVar30 = uVar30 >> 0x20 | uVar30 << 0x20;
  uVar17 = uVar17 + uVar30;
  uVar24 = uVar24 ^ uVar17;
  uVar24 = uVar24 >> 0x18 | uVar24 << 0x28;
  uVar29 = uVar29 + lVar10 + uVar24;
  uVar30 = uVar30 ^ uVar29;
  uVar30 = uVar30 >> 0x10 | uVar30 << 0x30;
  uVar17 = uVar17 + uVar30;
  uVar24 = uVar24 ^ uVar17;
  uVar24 = uVar24 >> 0x3f | uVar24 << 1;
  uVar19 = uVar19 + lVar13 + uVar24;
  uVar26 = uVar26 ^ uVar19;
  uVar26 = uVar26 >> 0x20 | uVar26 << 0x20;
  uVar20 = uVar20 + uVar26;
  uVar24 = uVar24 ^ uVar20;
  uVar24 = uVar24 >> 0x18 | uVar24 << 0x28;
  uVar19 = uVar19 + lVar6 + uVar24;
  uVar26 = uVar26 ^ uVar19;
  uVar26 = uVar26 >> 0x10 | uVar26 << 0x30;
  uVar20 = uVar20 + uVar26;
  uVar24 = uVar24 ^ uVar20;
  uVar24 = uVar24 >> 0x3f | uVar24 << 1;
  uVar23 = uVar23 + lVar2 + uVar21;
  uVar22 = uVar22 ^ uVar23;
  uVar22 = uVar22 >> 0x20 | uVar22 << 0x20;
  uVar17 = uVar17 + uVar22;
  uVar21 = uVar21 ^ uVar17;
  uVar21 = uVar21 >> 0x18 | uVar21 << 0x28;
  uVar23 = uVar23 + lVar16 + uVar21;
  uVar22 = uVar22 ^ uVar23;
  uVar22 = uVar22 >> 0x10 | uVar22 << 0x30;
  uVar17 = uVar17 + uVar22;
  uVar21 = uVar21 ^ uVar17;
  uVar21 = uVar21 >> 0x3f | uVar21 << 1;
  uVar27 = uVar27 + lVar15 + uVar32;
  uVar30 = uVar30 ^ uVar27;
  uVar30 = uVar30 >> 0x20 | uVar30 << 0x20;
  uVar18 = uVar18 + uVar30;
  uVar32 = uVar32 ^ uVar18;
  uVar32 = uVar32 >> 0x18 | uVar32 << 0x28;
  uVar27 = uVar27 + lVar14 + uVar32;
  uVar30 = uVar30 ^ uVar27;
  uVar30 = uVar30 >> 0x10 | uVar30 << 0x30;
  uVar18 = uVar18 + uVar30;
  uVar32 = uVar32 ^ uVar18;
  uVar32 = uVar32 >> 0x3f | uVar32 << 1;
  uVar29 = uVar29 + lVar5 + uVar28;
  uVar31 = uVar31 ^ uVar29;
  uVar31 = uVar31 >> 0x20 | uVar31 << 0x20;
  uVar25 = uVar25 + uVar31;
  uVar28 = uVar28 ^ uVar25;
  uVar28 = uVar28 >> 0x18 | uVar28 << 0x28;
  uVar29 = uVar29 + lVar11 + uVar28;
  uVar31 = uVar31 ^ uVar29;
  uVar31 = uVar31 >> 0x10 | uVar31 << 0x30;
  uVar25 = uVar25 + uVar31;
  uVar28 = uVar28 ^ uVar25;
  uVar28 = uVar28 >> 0x3f | uVar28 << 1;
  uVar19 = uVar19 + lVar1 + uVar21;
  uVar31 = uVar31 ^ uVar19;
  uVar31 = uVar31 >> 0x20 | uVar31 << 0x20;
  uVar18 = uVar18 + uVar31;
  uVar21 = uVar21 ^ uVar18;
  uVar21 = uVar21 >> 0x18 | uVar21 << 0x28;
  uVar19 = uVar19 + lVar8 + uVar21;
  uVar31 = uVar31 ^ uVar19;
  uVar31 = uVar31 >> 0x10 | uVar31 << 0x30;
  uVar18 = uVar18 + uVar31;
  uVar21 = uVar21 ^ uVar18;
  uVar21 = uVar21 >> 0x3f | uVar21 << 1;
  uVar23 = uVar23 + lVar7 + uVar32;
  uVar26 = uVar26 ^ uVar23;
  uVar26 = uVar26 >> 0x20 | uVar26 << 0x20;
  uVar25 = uVar25 + uVar26;
  uVar32 = uVar32 ^ uVar25;
  uVar32 = uVar32 >> 0x18 | uVar32 << 0x28;
  uVar23 = uVar23 + lVar4 + uVar32;
  uVar26 = uVar26 ^ uVar23;
  uVar26 = uVar26 >> 0x10 | uVar26 << 0x30;
  uVar25 = uVar25 + uVar26;
  uVar32 = uVar32 ^ uVar25;
  uVar32 = uVar32 >> 0x3f | uVar32 << 1;
  uVar27 = uVar27 + lVar10 + uVar28;
  uVar22 = uVar22 ^ uVar27;
  uVar22 = uVar22 >> 0x20 | uVar22 << 0x20;
  uVar20 = uVar20 + uVar22;
  uVar28 = uVar28 ^ uVar20;
  uVar28 = uVar28 >> 0x18 | uVar28 << 0x28;
  uVar27 = uVar27 + lVar3 + uVar28;
  uVar22 = uVar22 ^ uVar27;
  uVar22 = uVar22 >> 0x10 | uVar22 << 0x30;
  uVar20 = uVar20 + uVar22;
  uVar28 = uVar28 ^ uVar20;
  uVar28 = uVar28 >> 0x3f | uVar28 << 1;
  uVar29 = uVar29 + lVar9 + uVar24;
  uVar30 = uVar30 ^ uVar29;
  uVar30 = uVar30 >> 0x20 | uVar30 << 0x20;
  uVar17 = uVar17 + uVar30;
  uVar24 = uVar24 ^ uVar17;
  uVar24 = uVar24 >> 0x18 | uVar24 << 0x28;
  uVar29 = uVar29 + lVar12 + uVar24;
  uVar30 = uVar30 ^ uVar29;
  uVar30 = uVar30 >> 0x10 | uVar30 << 0x30;
  uVar17 = uVar17 + uVar30;
  uVar24 = uVar24 ^ uVar17;
  uVar24 = uVar24 >> 0x3f | uVar24 << 1;
  uVar19 = uVar19 + lVar14 + uVar24;
  uVar26 = uVar26 ^ uVar19;
  uVar26 = uVar26 >> 0x20 | uVar26 << 0x20;
  uVar20 = uVar20 + uVar26;
  uVar24 = uVar24 ^ uVar20;
  uVar24 = uVar24 >> 0x18 | uVar24 << 0x28;
  uVar19 = uVar19 + lVar12 + uVar24;
  uVar26 = uVar26 ^ uVar19;
  uVar26 = uVar26 >> 0x10 | uVar26 << 0x30;
  uVar20 = uVar20 + uVar26;
  uVar24 = uVar24 ^ uVar20;
  uVar24 = uVar24 >> 0x3f | uVar24 << 1;
  uVar23 = uVar23 + lVar8 + uVar21;
  uVar22 = uVar22 ^ uVar23;
  uVar22 = uVar22 >> 0x20 | uVar22 << 0x20;
  uVar17 = uVar17 + uVar22;
  uVar21 = uVar21 ^ uVar17;
  uVar21 = uVar21 >> 0x18 | uVar21 << 0x28;
  uVar23 = uVar23 + lVar15 + uVar21;
  uVar22 = uVar22 ^ uVar23;
  uVar22 = uVar22 >> 0x10 | uVar22 << 0x30;
  uVar17 = uVar17 + uVar22;
  uVar21 = uVar21 ^ uVar17;
  uVar21 = uVar21 >> 0x3f | uVar21 << 1;
  uVar27 = uVar27 + lVar13 + uVar32;
  uVar30 = uVar30 ^ uVar27;
  uVar30 = uVar30 >> 0x20 | uVar30 << 0x20;
  uVar18 = uVar18 + uVar30;
  uVar32 = uVar32 ^ uVar18;
  uVar32 = uVar32 >> 0x18 | uVar32 << 0x28;
  uVar27 = uVar27 + lVar2 + uVar32;
  uVar30 = uVar30 ^ uVar27;
  uVar30 = uVar30 >> 0x10 | uVar30 << 0x30;
  uVar18 = uVar18 + uVar30;
  uVar32 = uVar32 ^ uVar18;
  uVar32 = uVar32 >> 0x3f | uVar32 << 1;
  uVar29 = uVar29 + lVar4 + uVar28;
  uVar31 = uVar31 ^ uVar29;
  uVar31 = uVar31 >> 0x20 | uVar31 << 0x20;
  uVar25 = uVar25 + uVar31;
  uVar28 = uVar28 ^ uVar25;
  uVar28 = uVar28 >> 0x18 | uVar28 << 0x28;
  uVar29 = uVar29 + lVar10 + uVar28;
  uVar31 = uVar31 ^ uVar29;
  uVar31 = uVar31 >> 0x10 | uVar31 << 0x30;
  uVar25 = uVar25 + uVar31;
  uVar28 = uVar28 ^ uVar25;
  uVar28 = uVar28 >> 0x3f | uVar28 << 1;
  uVar19 = uVar19 + lVar6 + uVar21;
  uVar31 = uVar31 ^ uVar19;
  uVar31 = uVar31 >> 0x20 | uVar31 << 0x20;
  uVar18 = uVar18 + uVar31;
  uVar21 = uVar21 ^ uVar18;
  uVar21 = uVar21 >> 0x18 | uVar21 << 0x28;
  uVar19 = uVar19 + lVar1 + uVar21;
  uVar31 = uVar31 ^ uVar19;
  uVar31 = uVar31 >> 0x10 | uVar31 << 0x30;
  uVar18 = uVar18 + uVar31;
  uVar21 = uVar21 ^ uVar18;
  uVar21 = uVar21 >> 0x3f | uVar21 << 1;
  uVar23 = uVar23 + lVar16 + uVar32;
  uVar26 = uVar26 ^ uVar23;
  uVar26 = uVar26 >> 0x20 | uVar26 << 0x20;
  uVar25 = uVar25 + uVar26;
  uVar32 = uVar32 ^ uVar25;
  uVar32 = uVar32 >> 0x18 | uVar32 << 0x28;
  uVar23 = uVar23 + lVar5 + uVar32;
  uVar26 = uVar26 ^ uVar23;
  uVar26 = uVar26 >> 0x10 | uVar26 << 0x30;
  uVar25 = uVar25 + uVar26;
  uVar32 = uVar32 ^ uVar25;
  uVar32 = uVar32 >> 0x3f | uVar32 << 1;
  uVar27 = uVar27 + lVar9 + uVar28;
  uVar22 = uVar22 ^ uVar27;
  uVar22 = uVar22 >> 0x20 | uVar22 << 0x20;
  uVar20 = uVar20 + uVar22;
  uVar28 = uVar28 ^ uVar20;
  uVar28 = uVar28 >> 0x18 | uVar28 << 0x28;
  uVar27 = uVar27 + lVar7 + uVar28;
  uVar22 = uVar22 ^ uVar27;
  uVar22 = uVar22 >> 0x10 | uVar22 << 0x30;
  uVar20 = uVar20 + uVar22;
  uVar28 = uVar28 ^ uVar20;
  uVar28 = uVar28 >> 0x3f | uVar28 << 1;
  uVar29 = uVar29 + lVar3 + uVar24;
  uVar30 = uVar30 ^ uVar29;
  uVar30 = uVar30 >> 0x20 | uVar30 << 0x20;
  uVar17 = uVar17 + uVar30;
  uVar24 = uVar24 ^ uVar17;
  uVar24 = uVar24 >> 0x18 | uVar24 << 0x28;
  uVar29 = uVar29 + lVar11 + uVar24;
  uVar30 = uVar30 ^ uVar29;
  uVar30 = uVar30 >> 0x10 | uVar30 << 0x30;
  uVar17 = uVar17 + uVar30;
  uVar24 = uVar24 ^ uVar17;
  uVar24 = uVar24 >> 0x3f | uVar24 << 1;
  uVar19 = uVar19 + lVar7 + uVar24;
  uVar26 = uVar26 ^ uVar19;
  uVar26 = uVar26 >> 0x20 | uVar26 << 0x20;
  uVar20 = uVar20 + uVar26;
  uVar24 = uVar24 ^ uVar20;
  uVar24 = uVar24 >> 0x18 | uVar24 << 0x28;
  uVar19 = uVar19 + lVar16 + uVar24;
  uVar26 = uVar26 ^ uVar19;
  uVar26 = uVar26 >> 0x10 | uVar26 << 0x30;
  uVar20 = uVar20 + uVar26;
  uVar24 = uVar24 ^ uVar20;
  uVar24 = uVar24 >> 0x3f | uVar24 << 1;
  uVar23 = uVar23 + lVar15 + uVar21;
  uVar22 = uVar22 ^ uVar23;
  uVar22 = uVar22 >> 0x20 | uVar22 << 0x20;
  uVar17 = uVar17 + uVar22;
  uVar21 = uVar21 ^ uVar17;
  uVar21 = uVar21 >> 0x18 | uVar21 << 0x28;
  uVar23 = uVar23 + lVar10 + uVar21;
  uVar22 = uVar22 ^ uVar23;
  uVar22 = uVar22 >> 0x10 | uVar22 << 0x30;
  uVar17 = uVar17 + uVar22;
  uVar21 = uVar21 ^ uVar17;
  uVar21 = uVar21 >> 0x3f | uVar21 << 1;
  uVar27 = uVar27 + lVar12 + uVar32;
  uVar30 = uVar30 ^ uVar27;
  uVar30 = uVar30 >> 0x20 | uVar30 << 0x20;
  uVar18 = uVar18 + uVar30;
  uVar32 = uVar32 ^ uVar18;
  uVar33 = uVar32 >> 0x18 | uVar32 << 0x28;
  uVar27 = uVar27 + lVar4 + uVar33;
  uVar30 = uVar30 ^ uVar27;
  uVar32 = uVar30 >> 0x10 | uVar30 << 0x30;
  uVar18 = uVar18 + uVar32;
  uVar33 = uVar33 ^ uVar18;
  uVar30 = uVar33 >> 0x3f | uVar33 << 1;
  uVar29 = uVar29 + lVar1 + uVar28;
  uVar31 = uVar31 ^ uVar29;
  uVar31 = uVar31 >> 0x20 | uVar31 << 0x20;
  uVar25 = uVar25 + uVar31;
  uVar28 = uVar28 ^ uVar25;
  uVar28 = uVar28 >> 0x18 | uVar28 << 0x28;
  uVar29 = uVar29 + lVar9 + uVar28;
  uVar31 = uVar31 ^ uVar29;
  uVar31 = uVar31 >> 0x10 | uVar31 << 0x30;
  uVar25 = uVar25 + uVar31;
  uVar28 = uVar28 ^ uVar25;
  uVar28 = uVar28 >> 0x3f | uVar28 << 1;
  uVar19 = uVar19 + lVar13 + uVar21;
  uVar31 = uVar31 ^ uVar19;
  uVar31 = uVar31 >> 0x20 | uVar31 << 0x20;
  uVar18 = uVar18 + uVar31;
  uVar21 = uVar21 ^ uVar18;
  uVar21 = uVar21 >> 0x18 | uVar21 << 0x28;
  uVar19 = uVar19 + lVar3 + uVar21;
  uVar31 = uVar31 ^ uVar19;
  uVar31 = uVar31 >> 0x10 | uVar31 << 0x30;
  uVar18 = uVar18 + uVar31;
  uVar21 = uVar21 ^ uVar18;
  uVar21 = uVar21 >> 0x3f | uVar21 << 1;
  uVar23 = uVar23 + lVar14 + uVar30;
  uVar26 = uVar26 ^ uVar23;
  uVar26 = uVar26 >> 0x20 | uVar26 << 0x20;
  uVar25 = uVar25 + uVar26;
  uVar30 = uVar30 ^ uVar25;
  uVar30 = uVar30 >> 0x18 | uVar30 << 0x28;
  uVar23 = uVar23 + lVar8 + uVar30;
  uVar26 = uVar26 ^ uVar23;
  uVar26 = uVar26 >> 0x10 | uVar26 << 0x30;
  uVar25 = uVar25 + uVar26;
  uVar30 = uVar30 ^ uVar25;
  uVar33 = uVar30 >> 0x3f | uVar30 << 1;
  uVar27 = uVar27 + lVar2 + uVar28;
  uVar22 = uVar22 ^ uVar27;
  uVar22 = uVar22 >> 0x20 | uVar22 << 0x20;
  uVar20 = uVar20 + uVar22;
  uVar28 = uVar28 ^ uVar20;
  uVar30 = uVar28 >> 0x18 | uVar28 << 0x28;
  uVar28 = uVar27 + lVar5 + uVar30;
  uVar22 = uVar22 ^ uVar28;
  uVar22 = uVar22 >> 0x10 | uVar22 << 0x30;
  uVar20 = uVar20 + uVar22;
  uVar30 = uVar30 ^ uVar20;
  uVar30 = uVar30 >> 0x3f | uVar30 << 1;
  uVar29 = uVar29 + lVar11 + uVar24;
  uVar32 = uVar32 ^ uVar29;
  uVar27 = uVar32 >> 0x20 | uVar32 << 0x20;
  uVar17 = uVar17 + uVar27;
  uVar24 = uVar24 ^ uVar17;
  uVar24 = uVar24 >> 0x18 | uVar24 << 0x28;
  uVar29 = uVar29 + lVar6 + uVar24;
  uVar27 = uVar27 ^ uVar29;
  uVar32 = uVar27 >> 0x10 | uVar27 << 0x30;
  uVar17 = uVar17 + uVar32;
  uVar24 = uVar24 ^ uVar17;
  uVar24 = uVar24 >> 0x3f | uVar24 << 1;
  uVar19 = uVar19 + lVar11 + uVar24;
  uVar26 = uVar26 ^ uVar19;
  uVar26 = uVar26 >> 0x20 | uVar26 << 0x20;
  uVar20 = uVar20 + uVar26;
  uVar24 = uVar24 ^ uVar20;
  uVar24 = uVar24 >> 0x18 | uVar24 << 0x28;
  uVar19 = uVar19 + lVar3 + uVar24;
  uVar26 = uVar26 ^ uVar19;
  uVar27 = uVar26 >> 0x10 | uVar26 << 0x30;
  uVar20 = uVar20 + uVar27;
  uVar24 = uVar24 ^ uVar20;
  uVar24 = uVar24 >> 0x3f | uVar24 << 1;
  uVar23 = uVar23 + lVar9 + uVar21;
  uVar22 = uVar22 ^ uVar23;
  uVar22 = uVar22 >> 0x20 | uVar22 << 0x20;
  uVar17 = uVar17 + uVar22;
  uVar21 = uVar21 ^ uVar17;
  uVar21 = uVar21 >> 0x18 | uVar21 << 0x28;
  uVar26 = uVar23 + lVar5 + uVar21;
  uVar22 = uVar22 ^ uVar26;
  uVar22 = uVar22 >> 0x10 | uVar22 << 0x30;
  uVar17 = uVar17 + uVar22;
  uVar21 = uVar21 ^ uVar17;
  uVar23 = uVar21 >> 0x3f | uVar21 << 1;
  uVar21 = uVar28 + lVar8 + uVar33;
  uVar32 = uVar32 ^ uVar21;
  uVar32 = uVar32 >> 0x20 | uVar32 << 0x20;
  uVar18 = uVar18 + uVar32;
  uVar33 = uVar33 ^ uVar18;
  uVar33 = uVar33 >> 0x18 | uVar33 << 0x28;
  uVar28 = uVar21 + lVar7 + uVar33;
  uVar32 = uVar32 ^ uVar28;
  uVar32 = uVar32 >> 0x10 | uVar32 << 0x30;
  uVar18 = uVar18 + uVar32;
  uVar33 = uVar33 ^ uVar18;
  uVar33 = uVar33 >> 0x3f | uVar33 << 1;
  uVar29 = uVar29 + lVar2 + uVar30;
  uVar31 = uVar31 ^ uVar29;
  uVar31 = uVar31 >> 0x20 | uVar31 << 0x20;
  uVar25 = uVar25 + uVar31;
  uVar30 = uVar30 ^ uVar25;
  uVar21 = uVar30 >> 0x18 | uVar30 << 0x28;
  uVar29 = uVar29 + lVar6 + uVar21;
  uVar31 = uVar31 ^ uVar29;
  uVar31 = uVar31 >> 0x10 | uVar31 << 0x30;
  uVar25 = uVar25 + uVar31;
  uVar21 = uVar21 ^ uVar25;
  uVar30 = uVar21 >> 0x3f | uVar21 << 1;
  uVar19 = uVar19 + lVar16 + uVar23;
  uVar31 = uVar31 ^ uVar19;
  uVar21 = uVar31 >> 0x20 | uVar31 << 0x20;
  uVar18 = uVar18 + uVar21;
  uVar23 = uVar23 ^ uVar18;
  uVar23 = uVar23 >> 0x18 | uVar23 << 0x28;
  uVar31 = uVar19 + lVar12 + uVar23;
  uVar21 = uVar21 ^ uVar31;
  uVar21 = uVar21 >> 0x10 | uVar21 << 0x30;
  uVar18 = uVar18 + uVar21;
  uVar23 = uVar23 ^ uVar18;
  uVar23 = uVar23 >> 0x3f | uVar23 << 1;
  uVar19 = uVar26 + lVar10 + uVar33;
  uVar27 = uVar27 ^ uVar19;
  uVar27 = uVar27 >> 0x20 | uVar27 << 0x20;
  uVar25 = uVar25 + uVar27;
  uVar33 = uVar33 ^ uVar25;
  uVar33 = uVar33 >> 0x18 | uVar33 << 0x28;
  uVar26 = uVar19 + lVar15 + uVar33;
  uVar27 = uVar27 ^ uVar26;
  uVar27 = uVar27 >> 0x10 | uVar27 << 0x30;
  uVar25 = uVar25 + uVar27;
  uVar33 = uVar33 ^ uVar25;
  uVar33 = uVar33 >> 0x3f | uVar33 << 1;
  uVar19 = uVar28 + lVar4 + uVar30;
  uVar22 = uVar22 ^ uVar19;
  uVar22 = uVar22 >> 0x20 | uVar22 << 0x20;
  uVar20 = uVar20 + uVar22;
  uVar30 = uVar30 ^ uVar20;
  uVar30 = uVar30 >> 0x18 | uVar30 << 0x28;
  uVar28 = uVar19 + lVar13 + uVar30;
  uVar22 = uVar22 ^ uVar28;
  uVar22 = uVar22 >> 0x10 | uVar22 << 0x30;
  uVar20 = uVar20 + uVar22;
  uVar30 = uVar30 ^ uVar20;
  uVar30 = uVar30 >> 0x3f | uVar30 << 1;
  uVar29 = uVar29 + lVar14 + uVar24;
  uVar32 = uVar32 ^ uVar29;
  uVar32 = uVar32 >> 0x20 | uVar32 << 0x20;
  uVar17 = uVar17 + uVar32;
  uVar24 = uVar24 ^ uVar17;
  uVar24 = uVar24 >> 0x18 | uVar24 << 0x28;
  uVar19 = uVar29 + lVar1 + uVar24;
  uVar32 = uVar32 ^ uVar19;
  uVar32 = uVar32 >> 0x10 | uVar32 << 0x30;
  uVar17 = uVar17 + uVar32;
  uVar24 = uVar24 ^ uVar17;
  uVar24 = uVar24 >> 0x3f | uVar24 << 1;
  uVar29 = uVar31 + lVar1 + uVar24;
  uVar27 = uVar27 ^ uVar29;
  uVar27 = uVar27 >> 0x20 | uVar27 << 0x20;
  uVar20 = uVar20 + uVar27;
  uVar24 = uVar24 ^ uVar20;
  uVar24 = uVar24 >> 0x18 | uVar24 << 0x28;
  uVar31 = uVar29 + lVar2 + uVar24;
  uVar27 = uVar27 ^ uVar31;
  uVar27 = uVar27 >> 0x10 | uVar27 << 0x30;
  uVar20 = uVar20 + uVar27;
  uVar24 = uVar24 ^ uVar20;
  uVar24 = uVar24 >> 0x3f | uVar24 << 1;
  uVar29 = uVar26 + lVar3 + uVar23;
  uVar22 = uVar22 ^ uVar29;
  uVar22 = uVar22 >> 0x20 | uVar22 << 0x20;
  uVar17 = uVar17 + uVar22;
  uVar23 = uVar23 ^ uVar17;
  uVar23 = uVar23 >> 0x18 | uVar23 << 0x28;
  uVar26 = uVar29 + lVar4 + uVar23;
  uVar22 = uVar22 ^ uVar26;
  uVar29 = uVar22 >> 0x10 | uVar22 << 0x30;
  uVar17 = uVar17 + uVar29;
  uVar23 = uVar23 ^ uVar17;
  uVar23 = uVar23 >> 0x3f | uVar23 << 1;
  uVar22 = uVar28 + lVar5 + uVar33;
  uVar32 = uVar32 ^ uVar22;
  uVar32 = uVar32 >> 0x20 | uVar32 << 0x20;
  uVar18 = uVar18 + uVar32;
  uVar33 = uVar33 ^ uVar18;
  uVar33 = uVar33 >> 0x18 | uVar33 << 0x28;
  uVar28 = uVar22 + lVar6 + uVar33;
  uVar32 = uVar32 ^ uVar28;
  uVar32 = uVar32 >> 0x10 | uVar32 << 0x30;
  uVar18 = uVar18 + uVar32;
  uVar33 = uVar33 ^ uVar18;
  uVar33 = uVar33 >> 0x3f | uVar33 << 1;
  uVar22 = uVar19 + lVar7 + uVar30;
  uVar21 = uVar21 ^ uVar22;
  uVar21 = uVar21 >> 0x20 | uVar21 << 0x20;
  uVar25 = uVar25 + uVar21;
  uVar30 = uVar30 ^ uVar25;
  uVar30 = uVar30 >> 0x18 | uVar30 << 0x28;
  uVar19 = uVar22 + lVar8 + uVar30;
  uVar21 = uVar21 ^ uVar19;
  uVar21 = uVar21 >> 0x10 | uVar21 << 0x30;
  uVar25 = uVar25 + uVar21;
  uVar30 = uVar30 ^ uVar25;
  uVar30 = uVar30 >> 0x3f | uVar30 << 1;
  uVar22 = uVar31 + lVar9 + uVar23;
  uVar21 = uVar21 ^ uVar22;
  uVar31 = uVar21 >> 0x20 | uVar21 << 0x20;
  uVar18 = uVar18 + uVar31;
  uVar23 = uVar23 ^ uVar18;
  uVar23 = uVar23 >> 0x18 | uVar23 << 0x28;
  uVar22 = uVar22 + lVar10 + uVar23;
  uVar31 = uVar31 ^ uVar22;
  uVar21 = uVar31 >> 0x10 | uVar31 << 0x30;
  uVar18 = uVar18 + uVar21;
  uVar23 = uVar23 ^ uVar18;
  uVar23 = uVar23 >> 0x3f | uVar23 << 1;
  uVar31 = uVar26 + lVar11 + uVar33;
  uVar27 = uVar27 ^ uVar31;
  uVar26 = uVar27 >> 0x20 | uVar27 << 0x20;
  uVar25 = uVar25 + uVar26;
  uVar33 = uVar33 ^ uVar25;
  uVar33 = uVar33 >> 0x18 | uVar33 << 0x28;
  uVar27 = uVar31 + lVar12 + uVar33;
  uVar26 = uVar26 ^ uVar27;
  uVar31 = uVar26 >> 0x10 | uVar26 << 0x30;
  uVar25 = uVar25 + uVar31;
  uVar33 = uVar33 ^ uVar25;
  uVar33 = uVar33 >> 0x3f | uVar33 << 1;
  uVar26 = uVar28 + lVar13 + uVar30;
  uVar29 = uVar29 ^ uVar26;
  uVar29 = uVar29 >> 0x20 | uVar29 << 0x20;
  uVar20 = uVar20 + uVar29;
  uVar30 = uVar30 ^ uVar20;
  uVar30 = uVar30 >> 0x18 | uVar30 << 0x28;
  uVar28 = uVar26 + lVar14 + uVar30;
  uVar29 = uVar29 ^ uVar28;
  uVar29 = uVar29 >> 0x10 | uVar29 << 0x30;
  uVar20 = uVar20 + uVar29;
  uVar30 = uVar30 ^ uVar20;
  uVar30 = uVar30 >> 0x3f | uVar30 << 1;
  uVar19 = uVar19 + lVar15 + uVar24;
  uVar32 = uVar32 ^ uVar19;
  uVar26 = uVar32 >> 0x20 | uVar32 << 0x20;
  uVar17 = uVar17 + uVar26;
  uVar24 = uVar24 ^ uVar17;
  uVar24 = uVar24 >> 0x18 | uVar24 << 0x28;
  uVar19 = uVar19 + lVar16 + uVar24;
  uVar26 = uVar26 ^ uVar19;
  uVar32 = uVar26 >> 0x10 | uVar26 << 0x30;
  uVar17 = uVar17 + uVar32;
  uVar24 = uVar24 ^ uVar17;
  uVar26 = uVar24 >> 0x3f | uVar24 << 1;
  uVar24 = uVar22 + lVar15 + uVar26;
  uVar31 = uVar31 ^ uVar24;
  uVar27 = uVar27 + lVar5 + uVar23;
  uVar29 = uVar29 ^ uVar27;
  uVar28 = uVar28 + lVar10 + uVar33;
  uVar32 = uVar32 ^ uVar28;
  uVar19 = uVar19 + lVar14 + uVar30;
  uVar21 = uVar21 ^ uVar19;
  uVar22 = uVar31 >> 0x20 | uVar31 << 0x20;
  uVar20 = uVar20 + uVar22;
  uVar26 = uVar26 ^ uVar20;
  uVar26 = uVar26 >> 0x18 | uVar26 << 0x28;
  uVar24 = uVar24 + lVar11 + uVar26;
  uVar22 = uVar22 ^ uVar24;
  uVar31 = uVar22 >> 0x10 | uVar22 << 0x30;
  uVar20 = uVar20 + uVar31;
  uVar26 = uVar26 ^ uVar20;
  uVar26 = uVar26 >> 0x3f | uVar26 << 1;
  uVar22 = uVar29 >> 0x20 | uVar29 << 0x20;
  uVar17 = uVar17 + uVar22;
  uVar23 = uVar23 ^ uVar17;
  uVar23 = uVar23 >> 0x18 | uVar23 << 0x28;
  uVar27 = uVar27 + lVar9 + uVar23;
  uVar22 = uVar22 ^ uVar27;
  uVar29 = uVar22 >> 0x10 | uVar22 << 0x30;
  uVar17 = uVar17 + uVar29;
  uVar23 = uVar23 ^ uVar17;
  uVar23 = uVar23 >> 0x3f | uVar23 << 1;
  uVar22 = uVar32 >> 0x20 | uVar32 << 0x20;
  uVar18 = uVar18 + uVar22;
  uVar33 = uVar33 ^ uVar18;
  uVar33 = uVar33 >> 0x18 | uVar33 << 0x28;
  uVar28 = uVar28 + lVar16 + uVar33;
  uVar22 = uVar22 ^ uVar28;
  uVar32 = uVar22 >> 0x10 | uVar22 << 0x30;
  uVar18 = uVar18 + uVar32;
  uVar33 = uVar33 ^ uVar18;
  uVar33 = uVar33 >> 0x3f | uVar33 << 1;
  uVar21 = uVar21 >> 0x20 | uVar21 << 0x20;
  uVar25 = uVar25 + uVar21;
  uVar30 = uVar30 ^ uVar25;
  uVar30 = uVar30 >> 0x18 | uVar30 << 0x28;
  uVar22 = uVar19 + lVar7 + uVar30;
  uVar21 = uVar21 ^ uVar22;
  uVar21 = uVar21 >> 0x10 | uVar21 << 0x30;
  uVar25 = uVar25 + uVar21;
  uVar24 = uVar24 + lVar2 + uVar23;
  uVar21 = uVar21 ^ uVar24;
  uVar27 = uVar27 + lVar1 + uVar33;
  uVar31 = uVar31 ^ uVar27;
  uVar30 = uVar30 ^ uVar25;
  uVar30 = uVar30 >> 0x3f | uVar30 << 1;
  uVar28 = uVar28 + lVar12 + uVar30;
  uVar29 = uVar29 ^ uVar28;
  uVar19 = uVar22 + lVar6 + uVar26;
  uVar32 = uVar32 ^ uVar19;
  uVar21 = uVar21 >> 0x20 | uVar21 << 0x20;
  uVar18 = uVar18 + uVar21;
  uVar23 = uVar23 ^ uVar18;
  uVar23 = uVar23 >> 0x18 | uVar23 << 0x28;
  uVar22 = uVar24 + lVar13 + uVar23;
  uVar21 = uVar21 ^ uVar22;
  uVar21 = uVar21 >> 0x10 | uVar21 << 0x30;
  uVar18 = uVar18 + uVar21;
  uVar23 = uVar23 ^ uVar18;
  uVar24 = uVar31 >> 0x20 | uVar31 << 0x20;
  uVar25 = uVar25 + uVar24;
  uVar33 = uVar33 ^ uVar25;
  uVar33 = uVar33 >> 0x18 | uVar33 << 0x28;
  uVar27 = uVar27 + lVar3 + uVar33;
  uVar24 = uVar24 ^ uVar27;
  uVar31 = uVar24 >> 0x10 | uVar24 << 0x30;
  uVar25 = uVar25 + uVar31;
  uVar33 = uVar33 ^ uVar25;
  uVar24 = uVar29 >> 0x20 | uVar29 << 0x20;
  uVar20 = uVar20 + uVar24;
  uVar30 = uVar30 ^ uVar20;
  uVar30 = uVar30 >> 0x18 | uVar30 << 0x28;
  uVar28 = uVar28 + lVar8 + uVar30;
  uVar24 = uVar24 ^ uVar28;
  uVar29 = uVar24 >> 0x10 | uVar24 << 0x30;
  uVar20 = uVar20 + uVar29;
  uVar30 = uVar30 ^ uVar20;
  uVar32 = uVar32 >> 0x20 | uVar32 << 0x20;
  uVar17 = uVar17 + uVar32;
  uVar26 = uVar26 ^ uVar17;
  uVar24 = uVar26 >> 0x18 | uVar26 << 0x28;
  uVar19 = uVar19 + lVar4 + uVar24;
  uVar32 = uVar32 ^ uVar19;
  uVar26 = uVar32 >> 0x10 | uVar32 << 0x30;
  uVar17 = uVar17 + uVar26;
  uVar24 = uVar17 ^ uVar24;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = uVar21;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = uVar26;
  auVar36 = vpunpcklqdq_avx(auVar38,auVar36);
  auVar39._8_8_ = 0;
  auVar39._0_8_ = uVar29;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = uVar31;
  auVar38 = vpunpcklqdq_avx(auVar41,auVar39);
  auVar37._0_16_ = ZEXT116(0) * auVar36 + ZEXT116(1) * auVar38;
  auVar37._16_16_ = ZEXT116(1) * auVar36;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = uVar18;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = uVar25;
  auVar36 = vpunpcklqdq_avx(auVar42,auVar43);
  auVar44._8_8_ = 0;
  auVar44._0_8_ = uVar20;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = uVar17;
  auVar38 = vpunpcklqdq_avx(auVar44,auVar45);
  auVar34 = vinserti64x4_avx512f
                      (ZEXT3264(CONCAT1616(ZEXT116(1) * auVar36,
                                           ZEXT116(0) * auVar36 + ZEXT116(1) * auVar38)),auVar37,1);
  auVar46._8_8_ = 0;
  auVar46._0_8_ = uVar28;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = uVar19;
  auVar36 = vpunpcklqdq_avx(auVar46,auVar47);
  auVar48._8_8_ = 0;
  auVar48._0_8_ = uVar22;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = uVar27;
  auVar38 = vpunpcklqdq_avx(auVar48,auVar49);
  auVar50._8_8_ = 0;
  auVar50._0_8_ = uVar30 >> 0x3f | uVar30 << 1;
  auVar51._8_8_ = 0;
  auVar51._0_8_ = uVar33 >> 0x3f | uVar33 << 1;
  auVar39 = vpunpcklqdq_avx(auVar51,auVar50);
  auVar52._8_8_ = 0;
  auVar52._0_8_ = uVar23 >> 0x3f | uVar23 << 1;
  auVar53._8_8_ = 0;
  auVar53._0_8_ = uVar24 >> 0x3f | uVar24 << 1;
  auVar41 = vpunpcklqdq_avx(auVar53,auVar52);
  auVar40._0_16_ = ZEXT116(0) * auVar39 + ZEXT116(1) * auVar41;
  auVar40._16_16_ = ZEXT116(1) * auVar39;
  auVar35 = vinserti64x4_avx512f
                      (ZEXT3264(CONCAT1616(ZEXT116(1) * auVar36,
                                           ZEXT116(0) * auVar36 + ZEXT116(1) * auVar38)),auVar40,1);
  auVar34 = vpternlogq_avx512f(auVar35,auVar34,*(undefined1 (*) [64])(md->blake2b).h,0x96);
  auVar34 = vmovdqu64_avx512f(auVar34);
  *(undefined1 (*) [64])(md->blake2b).h = auVar34;
  return (int)md;
}

Assistant:

static int blake2b_compress(hash_state *md, const unsigned char *buf)
#endif
{
   ulong64 m[16];
   ulong64 v[16];
   unsigned long i;

   for (i = 0; i < 16; ++i) {
      LOAD64L(m[i], buf + i * sizeof(m[i]));
   }

   for (i = 0; i < 8; ++i) {
      v[i] = md->blake2b.h[i];
   }

   v[8] = blake2b_IV[0];
   v[9] = blake2b_IV[1];
   v[10] = blake2b_IV[2];
   v[11] = blake2b_IV[3];
   v[12] = blake2b_IV[4] ^ md->blake2b.t[0];
   v[13] = blake2b_IV[5] ^ md->blake2b.t[1];
   v[14] = blake2b_IV[6] ^ md->blake2b.f[0];
   v[15] = blake2b_IV[7] ^ md->blake2b.f[1];

   ROUND(0);
   ROUND(1);
   ROUND(2);
   ROUND(3);
   ROUND(4);
   ROUND(5);
   ROUND(6);
   ROUND(7);
   ROUND(8);
   ROUND(9);
   ROUND(10);
   ROUND(11);

   for (i = 0; i < 8; ++i) {
      md->blake2b.h[i] = md->blake2b.h[i] ^ v[i] ^ v[i + 8];
   }
   return CRYPT_OK;
}